

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O0

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp:82:72)>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  basic_stream_socket<asio::ip::tcp> *pbVar1;
  stream_core *psVar2;
  bool bVar3;
  want wVar4;
  size_t sVar5;
  error_code *peVar6;
  size_t local_170;
  size_t local_f8;
  size_t local_f0;
  time_point local_e8;
  time_point local_e0;
  time_point local_d8;
  const_buffer local_d0;
  mutable_buffer local_c0;
  const_buffer local_b0;
  mutable_buffer local_a0;
  mutable_buffer local_90;
  time_point local_80;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_78;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  mutable_buffer local_68;
  time_point local_58;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  const_buffer local_40;
  int local_2c;
  size_t sStack_28;
  int start_local;
  size_t bytes_transferred_local;
  io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>
  *this_local;
  error_code ec_local;
  
  ec_local._0_8_ = ec._M_cat;
  this_local._0_4_ = ec._M_value;
  this->start_ = start;
  local_2c = start;
  sStack_28 = bytes_transferred;
  bytes_transferred_local = (size_t)this;
  if (start != 1) goto LAB_0013fb40;
  do {
    wVar4 = handshake_op::operator()
                      (&this->op_,&this->core_->engine_,&this->ec_,&this->bytes_transferred_);
    this->want_ = wVar4;
    if (wVar4 == want_input_and_retry) {
      sVar5 = const_buffer::size(&this->core_->input_);
      if (sVar5 == 0) {
        local_48.__d.__r = (duration)stream_core::expiry(&this->core_->pending_read_);
        local_50.__d.__r = (duration)stream_core::neg_infin();
        bVar3 = std::chrono::operator==(&local_48,&local_50);
        if (!bVar3) {
          basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
          ::
          async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                    ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                      *)&this->core_->pending_read_,this);
          return;
        }
        psVar2 = this->core_;
        local_58 = stream_core::pos_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
        ::expires_at(&psVar2->pending_read_,&local_58);
        pbVar1 = this->next_layer_;
        local_68 = (mutable_buffer)asio::buffer(&this->core_->input_buffer_);
        basic_stream_socket<asio::ip::tcp>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (pbVar1,(mutable_buffers_1 *)&local_68,this);
        return;
      }
      local_40 = engine::put_input(&this->core_->engine_,&this->core_->input_);
      psVar2 = this->core_;
      (psVar2->input_).data_ = local_40.data_;
      (psVar2->input_).size_ = local_40.size_;
    }
    else {
      if ((wVar4 == want_output_and_retry) || (wVar4 == want_output)) {
        local_70.__d.__r = (duration)stream_core::expiry(&this->core_->pending_write_);
        local_78.__d.__r = (duration)stream_core::neg_infin();
        bVar3 = std::chrono::operator==(&local_70,&local_78);
        if (!bVar3) {
          basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
          ::
          async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                    ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                      *)&this->core_->pending_write_,this);
          return;
        }
        psVar2 = this->core_;
        local_80 = stream_core::pos_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
        ::expires_at(&psVar2->pending_write_,&local_80);
        pbVar1 = this->next_layer_;
        local_90 = engine::get_output(&this->core_->engine_,&this->core_->output_buffer_);
        async_write<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffer,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (pbVar1,&local_90,this,(type *)0x0);
        return;
      }
      if (local_2c != 0) {
        pbVar1 = this->next_layer_;
        local_a0 = (mutable_buffer)asio::buffer(&this->core_->input_buffer_,0);
        basic_stream_socket<asio::ip::tcp>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (pbVar1,(mutable_buffers_1 *)&local_a0,this);
        return;
      }
LAB_0013fb40:
      if (sStack_28 == 0xffffffffffffffff) {
        sStack_28 = 0;
      }
      else {
        bVar3 = std::error_code::operator_cast_to_bool(&this->ec_);
        if (!bVar3) {
          *(ulong *)&this->ec_ = CONCAT44(this_local._4_4_,(int)this_local);
          (this->ec_)._M_cat = (error_category *)ec_local._0_8_;
        }
      }
      wVar4 = this->want_;
      if (wVar4 == want_input_and_retry) {
        local_c0 = (mutable_buffer)asio::buffer(&this->core_->input_buffer_,sStack_28);
        const_buffer::const_buffer(&local_b0,&local_c0);
        psVar2 = this->core_;
        (psVar2->input_).data_ = local_b0.data_;
        (psVar2->input_).size_ = local_b0.size_;
        local_d0 = engine::put_input(&this->core_->engine_,&this->core_->input_);
        psVar2 = this->core_;
        (psVar2->input_).data_ = local_d0.data_;
        (psVar2->input_).size_ = local_d0.size_;
        psVar2 = this->core_;
        local_d8 = stream_core::neg_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
        ::expires_at(&psVar2->pending_read_,&local_d8);
      }
      else {
        if (wVar4 != want_output_and_retry) {
          if (wVar4 == want_output) {
            psVar2 = this->core_;
            local_e8 = stream_core::neg_infin();
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
            ::expires_at(&psVar2->pending_write_,&local_e8);
          }
          peVar6 = engine::map_error_code(&this->core_->engine_,&this->ec_);
          bVar3 = std::error_code::operator_cast_to_bool(&this->ec_);
          if (bVar3) {
            local_170 = 0;
          }
          else {
            local_170 = this->bytes_transferred_;
          }
          local_f0 = local_170;
          handshake_op::
          call_handler<SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>
                    (&this->op_,&this->handler_,peVar6,&local_f0);
          return;
        }
        psVar2 = this->core_;
        local_e0 = stream_core::neg_infin();
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
        ::expires_at(&psVar2->pending_write_,&local_e0);
      }
    }
    bVar3 = std::error_code::operator_cast_to_bool(&this->ec_);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      peVar6 = engine::map_error_code(&this->core_->engine_,&this->ec_);
      local_f8 = 0;
      handshake_op::
      call_handler<SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>
                (&this->op_,&this->handler_,peVar6,&local_f8);
      return;
    }
  } while( true );
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }